

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,BytesMode bytes_mode)

{
  CppType CVar1;
  Type TVar2;
  GeneratorOptions *pGVar3;
  uint *descriptor;
  FieldDescriptor *field_00;
  allocator *paVar4;
  char *pcVar5;
  allocator aStack_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  paVar4 = &aStack_28;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)options);
  descriptor = &switchD_0028bf48::switchdataD_003933fc;
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_INT64:
  case CPPTYPE_UINT32:
  case CPPTYPE_UINT64:
    JSIntegerTypeName_abi_cxx11_(__return_storage_ptr__,(_anonymous_namespace_ *)options,field_00);
    return __return_storage_ptr__;
  case CPPTYPE_DOUBLE:
    pcVar5 = "number";
    paVar4 = &local_27;
    break;
  case CPPTYPE_FLOAT:
    pcVar5 = "number";
    paVar4 = &local_26;
    break;
  case CPPTYPE_BOOL:
    pcVar5 = "boolean";
    paVar4 = &local_25;
    break;
  case CPPTYPE_ENUM:
    pGVar3 = (GeneratorOptions *)FieldDescriptor::enum_type((FieldDescriptor *)options);
    GetEnumPath_abi_cxx11_(__return_storage_ptr__,this,pGVar3,(EnumDescriptor *)descriptor);
    return __return_storage_ptr__;
  case CPPTYPE_STRING:
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    if (TVar2 == TYPE_BYTES) {
      if ((int)field == 2) {
        pcVar5 = "Uint8Array";
        paVar4 = &local_23;
      }
      else if ((int)field == 1) {
        pcVar5 = "string";
        paVar4 = &local_22;
      }
      else {
        pcVar5 = "(string|Uint8Array)";
        paVar4 = &local_21;
      }
    }
    else {
      pcVar5 = "string";
      paVar4 = &local_24;
    }
    break;
  case CPPTYPE_MESSAGE:
    pGVar3 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)options);
    GetMessagePath_abi_cxx11_(__return_storage_ptr__,this,pGVar3,(Descriptor *)descriptor);
    return __return_storage_ptr__;
  default:
    pcVar5 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,paVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string JSTypeName(const GeneratorOptions& options,
                       const FieldDescriptor* field, BytesMode bytes_mode) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return "boolean";
    case FieldDescriptor::CPPTYPE_INT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_INT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "number";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "number";
    case FieldDescriptor::CPPTYPE_STRING:
      return JSStringTypeName(options, field, bytes_mode);
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetEnumPath(options, field->enum_type());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return GetMessagePath(options, field->message_type());
    default:
      return "";
  }
}